

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.cpp
# Opt level: O2

void __thiscall
wasm::WasmBinaryWriter::writeHeapType(WasmBinaryWriter *this,HeapType type,Exactness exactness)

{
  bool bVar1;
  BasicHeapType BVar2;
  uint uVar3;
  uint32_t uVar4;
  S64LEB x;
  BufferWithRandomAccess *this_00;
  Exactness EVar5;
  HeapType local_28;
  HeapType type_local;
  
  uVar3 = (this->wasm->features).features;
  EVar5 = (int)(uVar3 << 10) >> 0x1f & exactness;
  local_28.id = type.id;
  if ((uVar3 >> 10 & 1) == 0) {
    BVar2 = HeapType::getTop(&local_28);
    local_28.id = (uintptr_t)BVar2;
  }
  if (EVar5 == Inexact || 0x7c < local_28.id) {
    if (EVar5 == Exact) {
      BufferWithRandomAccess::operator<<(this->o,'b');
    }
    if (local_28.id < 0x7d) {
      bVar1 = HeapType::isShared(&local_28);
      if (bVar1) {
        BufferWithRandomAccess::operator<<(this->o,'e');
      }
      BVar2 = HeapType::getBasic(&local_28,Unshared);
      uVar3 = BVar2 << 0x1d | BVar2 - ext >> 3;
      if (uVar3 < 0xf) {
        x.value = *(long *)(&DAT_00e545b8 + (ulong)uVar3 * 8);
      }
      else {
        x.value = 0;
      }
      this_00 = this->o;
    }
    else {
      this_00 = this->o;
      uVar4 = getTypeIndex(this,local_28);
      x.value = (long)uVar4;
    }
    BufferWithRandomAccess::operator<<(this_00,x);
    return;
  }
  __assert_fail("!type.isBasic() || exactness == Inexact",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-binary.cpp"
                ,0x699,"void wasm::WasmBinaryWriter::writeHeapType(HeapType, Exactness)");
}

Assistant:

void WasmBinaryWriter::writeHeapType(HeapType type, Exactness exactness) {
  // ref.null always has a bottom heap type in Binaryen IR, but those types are
  // only actually valid with GC. Otherwise, emit the corresponding valid top
  // types instead.
  if (!wasm->features.hasCustomDescriptors()) {
    exactness = Inexact;
  }
  if (!wasm->features.hasGC()) {
    type = type.getTop();
  }
  assert(!type.isBasic() || exactness == Inexact);
  if (exactness == Exact) {
    o << uint8_t(BinaryConsts::EncodedType::Exact);
  }
  if (!type.isBasic()) {
    o << S64LEB(getTypeIndex(type)); // TODO: Actually s33
    return;
  }

  int ret = 0;
  if (type.isShared()) {
    o << uint8_t(BinaryConsts::EncodedType::Shared);
  }
  switch (type.getBasic(Unshared)) {
    case HeapType::ext:
      ret = BinaryConsts::EncodedHeapType::ext;
      break;
    case HeapType::func:
      ret = BinaryConsts::EncodedHeapType::func;
      break;
    case HeapType::cont:
      ret = BinaryConsts::EncodedHeapType::cont;
      break;
    case HeapType::any:
      ret = BinaryConsts::EncodedHeapType::any;
      break;
    case HeapType::eq:
      ret = BinaryConsts::EncodedHeapType::eq;
      break;
    case HeapType::i31:
      ret = BinaryConsts::EncodedHeapType::i31;
      break;
    case HeapType::struct_:
      ret = BinaryConsts::EncodedHeapType::struct_;
      break;
    case HeapType::array:
      ret = BinaryConsts::EncodedHeapType::array;
      break;
    case HeapType::exn:
      ret = BinaryConsts::EncodedHeapType::exn;
      break;
    case HeapType::string:
      ret = BinaryConsts::EncodedHeapType::string;
      break;
    case HeapType::none:
      ret = BinaryConsts::EncodedHeapType::none;
      break;
    case HeapType::noext:
      ret = BinaryConsts::EncodedHeapType::noext;
      break;
    case HeapType::nofunc:
      ret = BinaryConsts::EncodedHeapType::nofunc;
      break;
    case HeapType::noexn:
      ret = BinaryConsts::EncodedHeapType::noexn;
      break;
    case HeapType::nocont:
      ret = BinaryConsts::EncodedHeapType::nocont;
      break;
  }
  o << S64LEB(ret); // TODO: Actually s33
}